

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O1

void rloco(obj *obj)

{
  char x;
  char y;
  boolean bVar1;
  char *pcVar2;
  char *pcVar3;
  int ty;
  int tx;
  int local_38;
  int local_34;
  
  x = obj->ox;
  y = obj->oy;
  if (((obj->otyp == 0x10e) && (obj->corpsenm - 0x144U < 3)) &&
     (bVar1 = revive_corpse(obj), bVar1 != '\0')) {
    return;
  }
  obj_extract_self(obj);
  rloco_pos(obj,level,&local_34,&local_38);
  bVar1 = flooreffects(obj,local_34,local_38,"fall");
  if (bVar1 != '\0') {
    return;
  }
  if (y == '\0' && x == '\0') goto LAB_0025b117;
  bVar1 = costly_spot(x,y);
  if (bVar1 != '\0') {
    bVar1 = costly_spot((xchar)local_34,(xchar)local_38);
    if (bVar1 != '\0') {
      pcVar2 = in_rooms(level,(xchar)local_34,(xchar)local_38,0);
      pcVar3 = in_rooms(level,x,y,0);
      pcVar2 = strchr(pcVar2,(int)*pcVar3);
      if (pcVar2 != (char *)0x0) goto LAB_0025b106;
    }
    bVar1 = costly_spot(u.ux,u.uy);
    if (bVar1 != '\0') {
      pcVar2 = in_rooms(level,x,y,0);
      pcVar2 = strchr(u.urooms,(int)*pcVar2);
      if (pcVar2 != (char *)0x0) {
        addtobill(obj,'\0','\0','\0');
        goto LAB_0025b106;
      }
    }
    stolen_value(obj,x,y,'\0','\0');
  }
LAB_0025b106:
  newsym((int)x,(int)y);
LAB_0025b117:
  place_object(obj,level,local_34,local_38);
  newsym(local_34,local_38);
  return;
}

Assistant:

void rloco(struct obj *obj)
{
	int tx, ty, otx, oty;

	otx = obj->ox;
	oty = obj->oy;

	if (obj->otyp == CORPSE && is_rider(&mons[obj->corpsenm])) {
	    if (revive_corpse(obj)) return;
	}

	obj_extract_self(obj);
	rloco_pos(obj, level, &tx, &ty);

	if (flooreffects(obj, tx, ty, "fall")) {
	    return;
	} else if (otx == 0 && oty == 0) {
	    ;	/* fell through a trap door; no update of old loc needed */
	} else {
	    if (costly_spot(otx, oty)
	      && (!costly_spot(tx, ty) ||
		  !strchr(in_rooms(level, tx, ty, 0), *in_rooms(level, otx, oty, 0)))) {
		if (costly_spot(u.ux, u.uy) &&
			    strchr(u.urooms, *in_rooms(level, otx, oty, 0)))
		    addtobill(obj, FALSE, FALSE, FALSE);
		else stolen_value(obj, otx, oty, FALSE, FALSE);
	    }
	    newsym(otx, oty);	/* update old location */
	}
	place_object(obj, level, tx, ty);
	newsym(tx, ty);
}